

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_RequiresFlags_Test::TestBody(TApp_RequiresFlags_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  Option *pOVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  AssertHelper local_1d0;
  Message local_1c8 [2];
  RequiresError *anon_var_0;
  char *pcStack_1b0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  iterator local_178;
  size_type local_170;
  undefined1 local_163;
  allocator local_162;
  allocator local_161 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [32];
  iterator local_118;
  size_type local_110;
  undefined1 local_102;
  allocator local_101 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  iterator local_d8;
  size_type local_d0;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  Option *local_18;
  Option *opt;
  TApp_RequiresFlags_Test *this_local;
  
  opt = (Option *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"-s,--string",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"--both",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"",&local_c1);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_98,&local_c0);
  CLI::Option::requires(pOVar2,local_18);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_102 = '\x01';
  local_101._1_8_ = &local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"-s",local_101);
  local_102 = '\0';
  local_d8 = &local_f8;
  local_d0 = 1;
  __l_01._M_len = 1;
  __l_01._M_array = local_d8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_01);
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8;
  do {
    local_230 = local_230 + -1;
    std::__cxx11::string::~string((string *)local_230);
  } while (local_230 != &local_f8);
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_163 = '\x01';
  local_161._1_8_ = &local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"-s",local_161);
  local_161._1_8_ = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"--both",&local_162);
  local_163 = '\0';
  local_118 = &local_158;
  local_110 = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_118;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118;
  do {
    local_268 = local_268 + -1;
    std::__cxx11::string::~string((string *)local_268);
  } while (local_268 != &local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_162);
  std::allocator<char>::~allocator((allocator<char> *)local_161);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_198,"--both",(allocator *)((long)&gtest_msg.value + 7));
  gtest_msg.value._6_1_ = 0;
  local_178 = &local_198;
  local_170 = 1;
  __l._M_len = 1;
  __l._M_array = local_178;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178;
  do {
    local_290 = local_290 + -1;
    std::__cxx11::string::~string((string *)local_290);
  } while (local_290 != &local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe50,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe50);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      return;
    }
    pcStack_1b0 = 
    "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_1c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_1d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x3e9,pcStack_1b0);
  testing::internal::AssertHelper::operator=(&local_1d0,local_1c8);
  testing::internal::AssertHelper::~AssertHelper(&local_1d0);
  testing::Message::~Message(local_1c8);
  return;
}

Assistant:

TEST_F(TApp, RequiresFlags) {
    CLI::Option *opt = app.add_flag("-s,--string");
    app.add_flag("--both")->requires(opt);

    run();

    app.reset();
    args = {"-s"};
    run();

    app.reset();
    args = {"-s", "--both"};
    run();

    app.reset();
    args = {"--both"};
    EXPECT_THROW(run(), CLI::RequiresError);
}